

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall
MipsParser::parseRspScalarElement(MipsParser *this,Parser *parser,MipsRegisterValue *dest)

{
  Token *pTVar1;
  int64_t iVar2;
  int64_t local_78;
  string local_70;
  Identifier local_50;
  Token *local_30;
  Token *token;
  MipsRegisterValue *dest_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  dest->type = RspScalarElement;
  token = (Token *)dest;
  dest_local = (MipsRegisterValue *)parser;
  parser_local = (Parser *)this;
  pTVar1 = Parser::nextToken(parser);
  if (((pTVar1->type == LBrack) &&
      (local_30 = Parser::nextToken((Parser *)dest_local), local_30->type == Integer)) &&
     (iVar2 = Token::intValue(local_30), iVar2 < 8)) {
    local_78 = Token::intValue(local_30);
    tinyformat::format<long>(&local_70,"%d",&local_78);
    Identifier::Identifier(&local_50,&local_70);
    Identifier::operator=((Identifier *)&token->column,&local_50);
    Identifier::~Identifier(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    iVar2 = Token::intValue(local_30);
    *(int *)((long)&(token->value).
                    super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                    super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .
                    super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .
                    super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
            + 0x10) = (int)iVar2 + 8;
    pTVar1 = Parser::nextToken((Parser *)dest_local);
    return pTVar1->type == RBrack;
  }
  return false;
}

Assistant:

bool MipsParser::parseRspScalarElement(Parser& parser, MipsRegisterValue& dest)
{
	dest.type = MipsRegisterType::RspScalarElement;

	if (parser.nextToken().type != TokenType::LBrack)
		return false;

	const Token &token = parser.nextToken();

	if (token.type != TokenType::Integer || token.intValue() >= 8)
		return false;

	dest.name = Identifier(tfm::format("%d", token.intValue()));
	dest.num = (int)token.intValue() + 8;

	return parser.nextToken().type == TokenType::RBrack;
}